

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvPostProcess.cpp
# Opt level: O1

void __thiscall spv::Builder::postProcessType(Builder *this,Instruction *inst,Id typeId)

{
  _Rb_tree_header *p_Var1;
  Op OVar2;
  uint uVar3;
  Instruction *pIVar4;
  bool bVar5;
  Op OVar6;
  int iVar7;
  StorageClass SVar8;
  undefined8 in_RAX;
  _Rb_tree_node_base *p_Var9;
  Id typeId_00;
  char *ext;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  OVar6 = getMostBasicTypeClass(this,typeId);
  iVar7 = 0;
  if (OVar6 - OpTypeInt < 2) {
    iVar7 = getScalarTypeWidth(this,typeId);
  }
  OVar2 = inst->opCode;
  if ((int)OVar2 < 0x43) {
    if (1 < OVar2 - OpLoad) {
      if (OVar2 == OpExtInst) {
        if ((*(inst->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p & 2) != 0) {
          __assert_fail("!idOperand[op]",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/spvIR.h"
                        ,0xa5,"unsigned int spv::Instruction::getImmediateOperand(int) const");
        }
        uVar3 = (inst->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start[1];
        if (uVar3 - 0x4c < 3) {
          if (0x102ff < this->spvVersion) {
            return;
          }
          bVar5 = containsType(this,typeId,OpTypeFloat,0x10);
          if (!bVar5) {
            return;
          }
          ext = "SPV_AMD_gpu_shader_half_float";
        }
        else {
          if (1 < uVar3 - 0x33) {
            return;
          }
          if (0x102ff < this->spvVersion) {
            return;
          }
          bVar5 = containsType(this,typeId,OpTypeInt,0x10);
          if (!bVar5) {
            return;
          }
          ext = "SPV_AMD_gpu_shader_int16";
        }
        addExtension(this,ext);
        return;
      }
      if (OVar2 != OpAccessChain) goto LAB_0046d3fc;
LAB_0046d425:
      if (OVar6 != OpTypeInt) {
        return;
      }
      if ((this->module).idToInstruction.
          super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
          super__Vector_impl_data._M_start[typeId]->opCode == OpTypePointer) {
        return;
      }
      if (iVar7 == 8) goto LAB_0046d574;
LAB_0046d531:
      if (iVar7 != 0x10) {
        return;
      }
      uStack_38 = CONCAT44(0x16,(undefined4)uStack_38);
      goto LAB_0046d586;
    }
    if (OVar6 == OpTypeStruct) {
      bVar5 = containsType(this,typeId,OpTypeInt,8);
      if (bVar5) {
        uStack_38 = CONCAT44(0x27,(undefined4)uStack_38);
        std::
        _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
        ::_M_insert_unique<spv::Capability_const&>
                  ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                    *)&this->capabilities,(Capability *)((long)&uStack_38 + 4));
      }
      bVar5 = containsType(this,typeId,OpTypeInt,0x10);
      if (bVar5) {
        uStack_38 = CONCAT44(0x16,(undefined4)uStack_38);
        std::
        _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
        ::_M_insert_unique<spv::Capability_const&>
                  ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                    *)&this->capabilities,(Capability *)((long)&uStack_38 + 4));
      }
      bVar5 = containsType(this,typeId,OpTypeFloat,0x10);
      if (!bVar5) {
        return;
      }
    }
    else {
      if ((*(inst->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p & 1) == 0) {
        __assert_fail("idOperand[op]",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/spvIR.h"
                      ,0xa1,"Id spv::Instruction::getIdOperand(int) const");
      }
      pIVar4 = (this->module).idToInstruction.
               super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
               super__Vector_impl_data._M_start
               [*(inst->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start];
      if (pIVar4 == (Instruction *)0x0) {
        typeId_00 = 0;
      }
      else {
        typeId_00 = pIVar4->typeId;
      }
      SVar8 = Module::getStorageClass(&this->module,typeId_00);
      if (iVar7 != 0x10) {
        if (iVar7 != 8) {
          return;
        }
        if ((SVar8 < (StorageBuffer|Input)) && ((0x1204U >> (SVar8 & 0x1f) & 1) != 0)) {
          return;
        }
        if (SVar8 == PhysicalStorageBuffer) {
          return;
        }
        goto LAB_0046d574;
      }
      if ((SVar8 < (StorageBuffer|Input)) && ((0x120eU >> (SVar8 & 0x1f) & 1) != 0)) {
        return;
      }
      if (SVar8 == PhysicalStorageBuffer) {
        return;
      }
      if (OVar6 == OpTypeInt) {
        uStack_38 = CONCAT44(0x16,(undefined4)uStack_38);
        std::
        _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
        ::_M_insert_unique<spv::Capability_const&>
                  ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                    *)&this->capabilities,(Capability *)((long)&uStack_38 + 4));
      }
      if (OVar6 != OpTypeFloat) {
        return;
      }
    }
  }
  else {
    if (OVar2 - OpUConvert < 3) {
      bVar5 = containsType(this,typeId,OpTypeFloat,0x10);
      if ((bVar5) || (bVar5 = containsType(this,typeId,OpTypeInt,0x10), bVar5)) {
        p_Var9 = (this->capabilities)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        p_Var1 = &(this->capabilities)._M_t._M_impl.super__Rb_tree_header;
        if ((_Rb_tree_header *)p_Var9 != p_Var1) {
          do {
            bVar5 = false;
            if (0xfffffffb < p_Var9[1]._M_color - 0x1155) {
              bVar5 = true;
              break;
            }
            p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9);
          } while ((_Rb_tree_header *)p_Var9 != p_Var1);
          if (bVar5) goto LAB_0046d2dc;
        }
        bVar5 = containsType(this,typeId,OpTypeFloat,0x10);
        if (bVar5) {
          uStack_38 = CONCAT44(9,(undefined4)uStack_38);
          std::
          _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
          ::_M_insert_unique<spv::Capability_const&>
                    ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                      *)&this->capabilities,(Capability *)((long)&uStack_38 + 4));
        }
        bVar5 = containsType(this,typeId,OpTypeInt,0x10);
        if (bVar5) {
          uStack_38 = CONCAT44(0x16,(undefined4)uStack_38);
          std::
          _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
          ::_M_insert_unique<spv::Capability_const&>
                    ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                      *)&this->capabilities,(Capability *)((long)&uStack_38 + 4));
        }
      }
LAB_0046d2dc:
      bVar5 = containsType(this,typeId,OpTypeInt,8);
      if (!bVar5) {
        return;
      }
      p_Var9 = (this->capabilities)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var1 = &(this->capabilities)._M_t._M_impl.super__Rb_tree_header;
      if ((_Rb_tree_header *)p_Var9 != p_Var1) {
        do {
          bVar5 = false;
          if (0xfffffffc < p_Var9[1]._M_color - 0x1163) {
            bVar5 = true;
            break;
          }
          p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9);
        } while ((_Rb_tree_header *)p_Var9 != p_Var1);
        if (bVar5) {
          return;
        }
      }
      uStack_38 = CONCAT44(0x27,(undefined4)uStack_38);
      goto LAB_0046d586;
    }
    if (OVar2 == OpPtrAccessChain) goto LAB_0046d425;
    if (OVar2 == OpCopyObject) {
      return;
    }
LAB_0046d3fc:
    if (OVar6 == OpTypeInt) {
      if (iVar7 == 8) {
LAB_0046d574:
        uStack_38 = CONCAT44(0x27,(undefined4)uStack_38);
        goto LAB_0046d586;
      }
      if (iVar7 == 0x40) {
        uStack_38 = CONCAT44(0xb,(undefined4)uStack_38);
        goto LAB_0046d586;
      }
      goto LAB_0046d531;
    }
    if (OVar6 != OpTypeFloat) {
      return;
    }
    if (iVar7 == 0x40) {
      uStack_38 = CONCAT44(10,(undefined4)uStack_38);
      goto LAB_0046d586;
    }
    if (iVar7 != 0x10) {
      return;
    }
  }
  uStack_38 = CONCAT44(9,(undefined4)uStack_38);
LAB_0046d586:
  std::
  _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
  ::_M_insert_unique<spv::Capability_const&>
            ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
              *)&this->capabilities,(Capability *)((long)&uStack_38 + 4));
  return;
}

Assistant:

void Builder::postProcessType(const Instruction& inst, Id typeId)
{
    // Characterize the type being questioned
    Id basicTypeOp = getMostBasicTypeClass(typeId);
    int width = 0;
    if (basicTypeOp == OpTypeFloat || basicTypeOp == OpTypeInt)
        width = getScalarTypeWidth(typeId);

    // Do opcode-specific checks
    switch (inst.getOpCode()) {
    case OpLoad:
    case OpStore:
        if (basicTypeOp == OpTypeStruct) {
            if (containsType(typeId, OpTypeInt, 8))
                addCapability(CapabilityInt8);
            if (containsType(typeId, OpTypeInt, 16))
                addCapability(CapabilityInt16);
            if (containsType(typeId, OpTypeFloat, 16))
                addCapability(CapabilityFloat16);
        } else {
            StorageClass storageClass = getStorageClass(inst.getIdOperand(0));
            if (width == 8) {
                switch (storageClass) {
                case StorageClassPhysicalStorageBufferEXT:
                case StorageClassUniform:
                case StorageClassStorageBuffer:
                case StorageClassPushConstant:
                    break;
                default:
                    addCapability(CapabilityInt8);
                    break;
                }
            } else if (width == 16) {
                switch (storageClass) {
                case StorageClassPhysicalStorageBufferEXT:
                case StorageClassUniform:
                case StorageClassStorageBuffer:
                case StorageClassPushConstant:
                case StorageClassInput:
                case StorageClassOutput:
                    break;
                default:
                    if (basicTypeOp == OpTypeInt)
                        addCapability(CapabilityInt16);
                    if (basicTypeOp == OpTypeFloat)
                        addCapability(CapabilityFloat16);
                    break;
                }
            }
        }
        break;
    case OpCopyObject:
        break;
    case OpFConvert:
    case OpSConvert:
    case OpUConvert:
        // Look for any 8/16-bit storage capabilities. If there are none, assume that
        // the convert instruction requires the Float16/Int8/16 capability.
        if (containsType(typeId, OpTypeFloat, 16) || containsType(typeId, OpTypeInt, 16)) {
            bool foundStorage = false;
            for (auto it = capabilities.begin(); it != capabilities.end(); ++it) {
                spv::Capability cap = *it;
                if (cap == spv::CapabilityStorageInputOutput16 ||
                    cap == spv::CapabilityStoragePushConstant16 ||
                    cap == spv::CapabilityStorageUniformBufferBlock16 ||
                    cap == spv::CapabilityStorageUniform16) {
                    foundStorage = true;
                    break;
                }
            }
            if (!foundStorage) {
                if (containsType(typeId, OpTypeFloat, 16))
                    addCapability(CapabilityFloat16);
                if (containsType(typeId, OpTypeInt, 16))
                    addCapability(CapabilityInt16);
            }
        }
        if (containsType(typeId, OpTypeInt, 8)) {
            bool foundStorage = false;
            for (auto it = capabilities.begin(); it != capabilities.end(); ++it) {
                spv::Capability cap = *it;
                if (cap == spv::CapabilityStoragePushConstant8 ||
                    cap == spv::CapabilityUniformAndStorageBuffer8BitAccess ||
                    cap == spv::CapabilityStorageBuffer8BitAccess) {
                    foundStorage = true;
                    break;
                }
            }
            if (!foundStorage) {
                addCapability(CapabilityInt8);
            }
        }
        break;
    case OpExtInst:
        switch (inst.getImmediateOperand(1)) {
        case GLSLstd450Frexp:
        case GLSLstd450FrexpStruct:
            if (getSpvVersion() < spv::Spv_1_3 && containsType(typeId, OpTypeInt, 16))
                addExtension(spv::E_SPV_AMD_gpu_shader_int16);
            break;
        case GLSLstd450InterpolateAtCentroid:
        case GLSLstd450InterpolateAtSample:
        case GLSLstd450InterpolateAtOffset:
            if (getSpvVersion() < spv::Spv_1_3 && containsType(typeId, OpTypeFloat, 16))
                addExtension(spv::E_SPV_AMD_gpu_shader_half_float);
            break;
        default:
            break;
        }
        break;
    case OpAccessChain:
    case OpPtrAccessChain:
        if (isPointerType(typeId))
            break;
        if (basicTypeOp == OpTypeInt) {
            if (width == 16)
                addCapability(CapabilityInt16);
            else if (width == 8)
                addCapability(CapabilityInt8);
        }
        break;
    default:
        if (basicTypeOp == OpTypeInt) {
            if (width == 16)
                addCapability(CapabilityInt16);
            else if (width == 8)
                addCapability(CapabilityInt8);
            else if (width == 64)
                addCapability(CapabilityInt64);
        } else if (basicTypeOp == OpTypeFloat) {
            if (width == 16)
                addCapability(CapabilityFloat16);
            else if (width == 64)
                addCapability(CapabilityFloat64);
        }
        break;
    }
}